

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O2

bool IsExpressionStatement(ParseNode *stmt,ScriptContext *scriptContext)

{
  OpCode OVar1;
  uint uVar2;
  ParseNodeFnc *pPVar3;
  bool bVar4;
  
  OVar1 = stmt->nop;
  if (OVar1 == 0x55) {
    pPVar3 = ParseNode::AsParseNodeFnc(stmt);
    bVar4 = (pPVar3->fncFlags & kFunctionDeclaration) == kFunctionNone;
  }
  else if (OVar1 < knopLim) {
    uVar2 = ParseNode::Grfnop((uint)OVar1);
    bVar4 = (uVar2 >> 10 & 1) == 0;
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool IsExpressionStatement(ParseNode* stmt, const Js::ScriptContext *const scriptContext)
{
    if (stmt->nop == knopFncDecl)
    {
        // 'knopFncDecl' is used for both function declarations and function expressions. In a program, a function expression
        // produces the function object that is created for the function expression as its value for the program. A function
        // declaration does not produce a value for the program.
        return !stmt->AsParseNodeFnc()->IsDeclaration();
    }
    if ((stmt->nop >= 0) && (stmt->nop<knopLim))
    {
        return (ParseNode::Grfnop(stmt->nop) & fnopNotExprStmt) == 0;
    }
    return false;
}